

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int disp_field_s_list(char *mesg,field_s *fp,int nfields)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  FILE *__stream;
  char *pcVar4;
  char *pcVar5;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stdout);
  }
  fprintf(_stdout,
          " %d fields:\n   name                  size   len   offset   type\n   -------------------   ----   ---   ------   --------------\n"
          ,(ulong)(uint)nfields);
  if (0 < nfields) {
    pcVar5 = fp->name;
    do {
      __stream = _stdout;
      uVar1 = *(uint *)(pcVar5 + -8);
      uVar2 = *(uint *)(pcVar5 + -4);
      uVar3 = *(uint *)(pcVar5 + -0xc);
      pcVar4 = field_type_str(((field_s *)(pcVar5 + -0x10))->type);
      fprintf(__stream,"   %-*s  %4d    %3d   %4d     %-14s\n",0x13,pcVar5,(ulong)uVar1,(ulong)uVar2
              ,(ulong)uVar3,pcVar4);
      pcVar5 = pcVar5 + 0x24;
      nfields = nfields + -1;
    } while (nfields != 0);
  }
  return 0;
}

Assistant:

int disp_field_s_list( char * mesg, field_s * fp, int nfields )
{
   int c;

   if( mesg ) fputs(mesg, stdout);

   fprintf(stdout," %d fields:\n"
           "   name                  size   len   offset   type\n"
           "   -------------------   ----   ---   ------   --------------\n",
           nfields);

   for( c = 0; c < nfields; c++, fp++ )
      fprintf(stdout,"   %-*s  %4d    %3d   %4d     %-14s\n",
                     NT_FIELD_NAME_LEN-1, fp->name, fp->size, fp->len,
                     fp->offset, field_type_str(fp->type));

   return 0;
}